

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::remap_ext_framebuffer_fetch
          (CompilerGLSL *this,uint32_t input_attachment_index,uint32_t color_location,bool coherent)

{
  pointer *pppVar1;
  pointer *pppVar2;
  iterator __position;
  iterator __position_00;
  pair<unsigned_int,_unsigned_int> pVar3;
  pair<unsigned_int,_bool> pVar4;
  pair<unsigned_int,_bool> local_20;
  
  __position._M_current =
       (this->subpass_to_framebuffer_fetch_attachment).
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->subpass_to_framebuffer_fetch_attachment).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.first = input_attachment_index;
    local_20._4_4_ = color_location;
    ::std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&this->subpass_to_framebuffer_fetch_attachment,__position,
               (pair<unsigned_int,_unsigned_int> *)&local_20);
  }
  else {
    pVar3.second = color_location;
    pVar3.first = input_attachment_index;
    *__position._M_current = pVar3;
    pppVar1 = &(this->subpass_to_framebuffer_fetch_attachment).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
    local_20._4_4_ = color_location;
  }
  local_20.second = coherent;
  __position_00._M_current =
       (this->inout_color_attachments).
       super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->inout_color_attachments).
      super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.first = color_location;
    ::std::vector<std::pair<unsigned_int,bool>,std::allocator<std::pair<unsigned_int,bool>>>::
    _M_realloc_insert<std::pair<unsigned_int,bool>>
              ((vector<std::pair<unsigned_int,bool>,std::allocator<std::pair<unsigned_int,bool>>> *)
               &this->inout_color_attachments,__position_00,&local_20);
  }
  else {
    pVar4.second = coherent;
    pVar4._5_3_ = local_20._5_3_;
    pVar4.first = color_location;
    *__position_00._M_current = pVar4;
    pppVar2 = &(this->inout_color_attachments).
               super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar2 = *pppVar2 + 1;
  }
  return;
}

Assistant:

void CompilerGLSL::remap_ext_framebuffer_fetch(uint32_t input_attachment_index, uint32_t color_location, bool coherent)
{
	subpass_to_framebuffer_fetch_attachment.push_back({ input_attachment_index, color_location });
	inout_color_attachments.push_back({ color_location, coherent });
}